

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.cpp
# Opt level: O2

bool __thiscall spirv_cross::Parser::variable_storage_is_aliased(Parser *this,SPIRVariable *v)

{
  int iVar1;
  bool bVar2;
  SPIRType *pSVar3;
  Meta *pMVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  Bitset local_68;
  
  pSVar3 = get<spirv_cross::SPIRType>(this,*(uint32_t *)&(v->super_IVariant).field_0xc);
  pMVar4 = ParsedIR::find_meta(&this->ir,(ID)(pSVar3->super_IVariant).self.id);
  if (v->storage == StorageClassStorageBuffer) {
    iVar1 = *(int *)&(pSVar3->super_IVariant).field_0xc;
    bVar6 = iVar1 == 0x10;
    bVar7 = iVar1 == 0xb;
LAB_00381629:
    ParsedIR::get_buffer_block_flags(&local_68,&this->ir,v);
    bVar5 = (bool)((byte)((uint)local_68.lower >> 0x13) & 1);
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_68.higher._M_h);
    bVar2 = true;
  }
  else {
    if (pMVar4 == (Meta *)0x0) {
      iVar1 = *(int *)&(pSVar3->super_IVariant).field_0xc;
      bVar6 = iVar1 == 0x10;
      bVar7 = iVar1 == 0xb;
    }
    else {
      iVar1 = *(int *)&(pSVar3->super_IVariant).field_0xc;
      bVar6 = iVar1 == 0x10;
      bVar7 = iVar1 == 0xb;
      if (((pMVar4->decoration).decoration_flags.lower & 8) != 0) goto LAB_00381629;
    }
    bVar5 = ParsedIR::has_decoration(&this->ir,(ID)(v->super_IVariant).self.id,DecorationRestrict);
    bVar2 = false;
  }
  bVar6 = (bool)(bVar7 | bVar6);
  if (bVar5 != false) {
    bVar6 = (bool)(bVar5 ^ 1U);
  }
  if (bVar2) {
    bVar6 = (bool)(bVar5 ^ 1U);
  }
  return bVar6;
}

Assistant:

bool Parser::variable_storage_is_aliased(const SPIRVariable &v) const
{
	auto &type = get<SPIRType>(v.basetype);

	auto *type_meta = ir.find_meta(type.self);

	bool ssbo = v.storage == StorageClassStorageBuffer ||
	            (type_meta && type_meta->decoration.decoration_flags.get(DecorationBufferBlock));
	bool image = type.basetype == SPIRType::Image;
	bool counter = type.basetype == SPIRType::AtomicCounter;

	bool is_restrict;
	if (ssbo)
		is_restrict = ir.get_buffer_block_flags(v).get(DecorationRestrict);
	else
		is_restrict = ir.has_decoration(v.self, DecorationRestrict);

	return !is_restrict && (ssbo || image || counter);
}